

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  int iVar1;
  int rc;
  char **pzErrMsg_local;
  char *zProc_local;
  char *zFile_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  iVar1 = sqlite3LoadExtension(db,zFile,zProc,pzErrMsg);
  iVar1 = sqlite3ApiExit(db,iVar1);
  sqlite3_mutex_leave(db->mutex);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}